

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

gost_cipher_info * get_encryption_params(ASN1_OBJECT *obj)

{
  gost_cipher_info *pgVar1;
  int iVar2;
  char *s;
  gost_cipher_info *pgVar3;
  
  if (obj == (ASN1_OBJECT *)0x0) {
    s = get_gost_engine_param(0);
    if ((s == (char *)0x0) || (*s == '\0')) {
      pgVar3 = gost_cipher_list;
      while( true ) {
        if (pgVar3->nid == 0) {
          return gost_cipher_list;
        }
        if (pgVar3->nid == 0x3eb) break;
        pgVar3 = pgVar3 + 1;
      }
      return pgVar3;
    }
    iVar2 = OBJ_txt2nid(s);
    if (iVar2 == 0) {
      ERR_GOST_error(0x67,0x6f,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                     ,0x17f);
      ERR_add_error_data(3,"Unsupported CRYPT_PARAMS=\'",s,
                         "\' specified in environment or in config");
      return (gost_cipher_info *)0x0;
    }
  }
  else {
    iVar2 = OBJ_obj2nid((ASN1_OBJECT *)obj);
  }
  if (gost_cipher_list[0].sblock != (gost_subst_block *)0x0) {
    pgVar3 = gost_cipher_list;
    do {
      if (pgVar3->nid == iVar2) {
        return pgVar3;
      }
      pgVar1 = pgVar3 + 1;
      pgVar3 = pgVar3 + 1;
    } while (pgVar1->sblock != (gost_subst_block *)0x0);
  }
  ERR_GOST_error(0x67,0x6e,
                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                 ,0x18a);
  return (gost_cipher_info *)0x0;
}

Assistant:

const struct gost_cipher_info *get_encryption_params(ASN1_OBJECT *obj)
{
    int nid;
    struct gost_cipher_info *param;
    if (!obj) {
        const char *params = get_gost_engine_param(GOST_PARAM_CRYPT_PARAMS);
        if (!params || !strlen(params)) {
            int i;
            for (i = 0; gost_cipher_list[i].nid != NID_undef; i++)
                if (gost_cipher_list[i].nid == NID_id_tc26_gost_28147_param_Z)
                    return &gost_cipher_list[i];
            return &gost_cipher_list[0];
        }

        nid = OBJ_txt2nid(params);
        if (nid == NID_undef) {
            GOSTerr(GOST_F_GET_ENCRYPTION_PARAMS,
                    GOST_R_INVALID_CIPHER_PARAM_OID);
            ERR_add_error_data(3, "Unsupported CRYPT_PARAMS='",
                params, "' specified in environment or in config");
            return NULL;
        }
    } else {
        nid = OBJ_obj2nid(obj);
    }
    for (param = gost_cipher_list; param->sblock != NULL && param->nid != nid;
         param++) ;
    if (!param->sblock) {
        GOSTerr(GOST_F_GET_ENCRYPTION_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        return NULL;
    }
    return param;
}